

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void upb::generator::anon_unknown_3::WriteExtension
               (DefPoolPair *pools,FieldDefPtr ext,Output *output)

{
  anon_union_8_3_dbd58ed1_for_sub aVar1;
  undefined1 is_extension;
  FieldDefPtr field;
  string *__return_storage_ptr__;
  FieldDefPtr ext_00;
  MessageDefPtr message;
  string_view local_130;
  DefPoolPair *local_120;
  string local_118;
  string_view local_f8;
  upb_MessageDef *local_e8;
  string local_e0;
  string_view local_c0;
  DefPoolPair *local_b0;
  string local_a8;
  string_view local_88 [2];
  DefPoolPair *local_68;
  undefined1 local_60 [32];
  string_view local_40;
  string_view local_30;
  anon_union_8_3_dbd58ed1_for_sub local_20;
  Output *output_local;
  DefPoolPair *pools_local;
  FieldDefPtr ext_local;
  
  local_20 = (anon_union_8_3_dbd58ed1_for_sub)output;
  output_local = (Output *)pools;
  pools_local = (DefPoolPair *)ext.ptr_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"UPB_LINKARR_APPEND(upb_AllExts)\n");
  Output::operator()<>(output,local_30);
  aVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"const upb_MiniTableExtension $0 = {\n  ");
  local_68 = pools_local;
  field.ptr_ = (upb_FieldDef *)local_60;
  (anonymous_namespace)::ExtensionVarName_abi_cxx11_
            ((string *)field.ptr_,(_anonymous_namespace_ *)pools_local,ext_00);
  Output::operator()((Output *)aVar1.msgdef,local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field.ptr_
                    );
  std::__cxx11::string::~string((string *)local_60);
  aVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_88,"$0,\n");
  local_b0 = pools_local;
  (anonymous_namespace)::FieldInitializer_abi_cxx11_
            (&local_a8,(_anonymous_namespace_ *)output_local,pools_local,field);
  Output::operator()((Output *)aVar1.msgdef,local_88[0],&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  aVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,"  &$0,\n");
  local_e8 = (upb_MessageDef *)FieldDefPtr::containing_type((FieldDefPtr *)&pools_local);
  __return_storage_ptr__ = &local_e0;
  (anonymous_namespace)::MessageVarName_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)local_e8,message);
  Output::operator()((Output *)aVar1.msgdef,local_c0,__return_storage_ptr__);
  is_extension = SUB81(__return_storage_ptr__,0);
  std::__cxx11::string::~string((string *)&local_e0);
  aVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8,"  $0,\n");
  local_120 = pools_local;
  (anonymous_namespace)::GetSub_abi_cxx11_
            (&local_118,(_anonymous_namespace_ *)pools_local,(FieldDefPtr)0x1,(bool)is_extension);
  Output::operator()((Output *)aVar1.msgdef,local_f8,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  aVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130,"\n};\n");
  Output::operator()<>((Output *)aVar1.msgdef,local_130);
  return;
}

Assistant:

void WriteExtension(const DefPoolPair& pools, upb::FieldDefPtr ext,
                    Output& output) {
  output("UPB_LINKARR_APPEND(upb_AllExts)\n");
  output("const upb_MiniTableExtension $0 = {\n  ", ExtensionVarName(ext));
  output("$0,\n", FieldInitializer(pools, ext));
  output("  &$0,\n", MessageVarName(ext.containing_type()));
  output("  $0,\n", GetSub(ext, true));
  output("\n};\n");
}